

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall
BuildWithQueryDepsLogTest::~BuildWithQueryDepsLogTest(BuildWithQueryDepsLogTest *this)

{
  BuildWithQueryDepsLogTest *this_local;
  
  (this->super_BuildTest).super_StateTestWithBuiltinRules.super_Test._vptr_Test =
       (_func_int **)&PTR__BuildWithQueryDepsLogTest_002a3950;
  (this->super_BuildTest).super_BuildLogUser._vptr_BuildLogUser = (_func_int **)&DAT_002a3990;
  DepsLog::Close(&this->log_);
  DepsLog::~DepsLog(&this->log_);
  ScopedTempDir::~ScopedTempDir(&this->temp_dir_);
  BuildTest::~BuildTest(&this->super_BuildTest);
  return;
}

Assistant:

~BuildWithQueryDepsLogTest() {
    log_.Close();
  }